

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processLogAndErrorCommand(CommonCore *this,ActionMessage *cmd)

{
  BrokerBase *this_00;
  action_t aVar1;
  BaseTimeCoordinator *pBVar2;
  string_view message;
  string_view message_00;
  string *psVar3;
  size_type sVar4;
  int iVar5;
  GlobalFederateId GVar6;
  bool bVar8;
  string_view message_01;
  string_view estring;
  string_view estring_00;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view name;
  string_view name_00;
  size_t sVar9;
  byte *pbVar10;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  const_iterator local_48;
  pointer pcVar7;
  
  aVar1 = cmd->messageAction;
  if (aVar1 != cmd_log) {
    if (aVar1 == cmd_global_error) {
      if ((this->super_BrokerBase).brokerState._M_i == CONNECTING) {
        processDisconnect(this,false);
      }
      estring_00._M_str = (char *)(cmd->payload).heap;
      estring_00._M_len = (cmd->payload).bufferSize;
      BrokerBase::setErrorState(&this->super_BrokerBase,cmd->messageID,estring_00);
      if (6 < (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR)) {
        return;
      }
      message_02._M_str = (char *)(cmd->payload).heap;
      message_02._M_len = (cmd->payload).bufferSize;
      sendErrorToFederates(this,cmd->messageID,message_02);
      iVar5 = (cmd->source_id).gid;
      if (iVar5 == 1 || iVar5 == (this->super_BrokerBase).higher_broker_id.gid) {
        return;
      }
LAB_00296f3c:
      (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
      return;
    }
    if (aVar1 == cmd_warning) {
      if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid)
      goto LAB_00296d92;
      GVar6.gid = (cmd->source_id).gid;
      psVar3 = ActionMessage::getString_abi_cxx11_(cmd,0);
      pcVar7 = (psVar3->_M_dataplus)._M_p;
      sVar4 = psVar3->_M_string_length;
      sVar9 = (cmd->payload).bufferSize;
      pbVar10 = (cmd->payload).heap;
      iVar5 = 3;
      bVar8 = false;
      goto LAB_00296d88;
    }
    if ((aVar1 == cmd_error) || (aVar1 == cmd_local_error)) {
      this_00 = &this->super_BrokerBase;
      iVar5 = (cmd->dest_id).gid;
      if (iVar5 == (this->super_BrokerBase).global_broker_id_local.gid) {
        GVar6.gid = (cmd->source_id).gid;
        if ((uint)GVar6.gid < 2 || GVar6.gid == (this->super_BrokerBase).higher_broker_id.gid) {
          message_01._M_str = (char *)(cmd->payload).heap;
          message_01._M_len = (cmd->payload).bufferSize;
          sendErrorToFederates(this,cmd->messageID,message_01);
          estring._M_str = (char *)(cmd->payload).heap;
          estring._M_len = (cmd->payload).bufferSize;
          BrokerBase::setErrorState(this_00,cmd->messageID,estring);
        }
        else {
          psVar3 = getFederateNameNoThrow_abi_cxx11_(this,GVar6);
          message_00._M_str = (char *)(cmd->payload).heap;
          message_00._M_len = (cmd->payload).bufferSize;
          name_00._M_str = (psVar3->_M_dataplus)._M_p;
          name_00._M_len = psVar3->_M_string_length;
          BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_00,message_00,false);
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::find(&fed,&this->loopFederates,&cmd->source_id);
          gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
          ::end(&local_48,&(this->loopFederates).dataStorage);
          bVar8 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                            ((BlockIterator<helics::FedInfo,32,helics::FedInfo**> *)&fed,&local_48);
          if (bVar8) {
            if ((cmd->flags & 0x20) == 0) {
              (fed.ptr)->state = ERROR_STATE;
            }
            else {
              FederateState::addAction((fed.ptr)->fed,cmd);
            }
          }
          else if ((cmd->source_id).gid == (this->filterFedID)._M_i.gid) {
            FilterFederate::handleMessage(this->filterFed,cmd);
          }
          if ((this->super_BrokerBase).hasTimeDependency == true) {
            pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
            (*pBVar2->_vptr_BaseTimeCoordinator[3])(pBVar2,cmd);
          }
        }
        if ((this->super_BrokerBase).terminate_on_error != true) {
          return;
        }
        if (((this->super_BrokerBase).brokerState._M_i != ERRORED) &&
           ((this->super_BrokerBase).brokerState._M_i != CONNECTED_ERROR)) {
          message_04._M_str = (char *)(cmd->payload).heap;
          message_04._M_len = (cmd->payload).bufferSize;
          sendErrorToFederates(this,cmd->messageID,message_04);
          BrokerBase::setBrokerState(this_00,ERRORED);
        }
        ActionMessage::setAction(cmd,cmd_global_error);
        (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
        (cmd->dest_id).gid = 1;
        (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
        return;
      }
      if (iVar5 == 0) {
        if ((this->super_BrokerBase).terminate_on_error == true) {
          if ((this->super_BrokerBase).brokerState._M_i != ERRORED) {
            message_03._M_str = (char *)(cmd->payload).heap;
            message_03._M_len = (cmd->payload).bufferSize;
            sendErrorToFederates(this,cmd->messageID,message_03);
            BrokerBase::setBrokerState(this_00,ERRORED);
          }
          ActionMessage::setAction(cmd,cmd_global_error);
          (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          (cmd->dest_id).gid = 1;
          goto LAB_00296f3c;
        }
        iVar5 = (cmd->source_id).gid;
        if ((iVar5 != -2010000000) && (iVar5 != -1700000000)) {
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::find(&fed,&this->loopFederates,&cmd->source_id);
          gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
          ::end(&local_48,&(this->loopFederates).dataStorage);
          bVar8 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                            ((BlockIterator<helics::FedInfo,32,helics::FedInfo**> *)&fed,&local_48);
          if (bVar8) {
            (fed.ptr)->state = ERROR_STATE;
          }
        }
      }
      routeMessage(this,cmd);
      return;
    }
    if (aVar1 != cmd_remote_log) {
      return;
    }
  }
  if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_00296d92:
    routeMessage(this,cmd);
    return;
  }
  iVar5 = cmd->messageID;
  psVar3 = ActionMessage::getString_abi_cxx11_(cmd,0);
  pcVar7 = (psVar3->_M_dataplus)._M_p;
  sVar4 = psVar3->_M_string_length;
  sVar9 = (cmd->payload).bufferSize;
  pbVar10 = (cmd->payload).heap;
  bVar8 = cmd->messageAction == cmd_remote_log;
  GVar6.gid = 0;
LAB_00296d88:
  message._M_str = (char *)pbVar10;
  message._M_len = sVar9;
  name._M_str = pcVar7;
  name._M_len = sVar4;
  BrokerBase::sendToLogger(&this->super_BrokerBase,GVar6,iVar5,name,message,bVar8);
  return;
}

Assistant:

void CommonCore::processLogAndErrorCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(parent_broker_id,
                             cmd.messageID,
                             cmd.getString(0),
                             cmd.payload.to_string(),
                             cmd.action() == CMD_REMOTE_LOG);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_WARNING:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(cmd.source_id,
                             LogLevels::WARNING,
                             cmd.getString(0),
                             cmd.payload.to_string());
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
            if (cmd.dest_id == global_broker_id_local) {
                if (cmd.source_id == higher_broker_id || cmd.source_id == parent_broker_id ||
                    cmd.source_id == gRootBrokerID) {
                    sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                    setErrorState(cmd.messageID, cmd.payload.to_string());

                } else {
                    sendToLogger(parent_broker_id,
                                 LogLevels::ERROR_LEVEL,
                                 getFederateNameNoThrow(cmd.source_id),
                                 cmd.payload.to_string());
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed != loopFederates.end()) {
                        if (checkActionFlag(cmd, indicator_flag)) {
                            fed->fed->addAction(cmd);
                        } else {
                            fed->state = OperatingState::ERROR_STATE;
                        }

                    } else if (cmd.source_id == filterFedID) {
                        filterFed->handleMessage(cmd);
                        // filterFed->
                    }

                    if (hasTimeDependency) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                if (terminate_on_error) {
                    if (getBrokerState() != BrokerState::ERRORED &&
                        getBrokerState() != BrokerState::CONNECTED_ERROR) {
                        sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                        setBrokerState(BrokerState::ERRORED);
                    }
                    cmd.setAction(CMD_GLOBAL_ERROR);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = gRootBrokerID;
                    transmit(parent_route_id, std::move(cmd));
                }
            } else {
                if (cmd.dest_id == parent_broker_id) {
                    if (terminate_on_error) {
                        if (getBrokerState() != BrokerState::ERRORED) {
                            sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                            setBrokerState(BrokerState::ERRORED);
                        }
                        cmd.setAction(CMD_GLOBAL_ERROR);
                        cmd.source_id = global_broker_id_local;
                        cmd.dest_id = gRootBrokerID;
                        transmit(parent_route_id, std::move(cmd));
                        break;
                    }
                    if (cmd.source_id.isValid()) {
                        auto fed = loopFederates.find(cmd.source_id);
                        if (fed != loopFederates.end()) {
                            fed->state = OperatingState::ERROR_STATE;
                        }
                    }
                }
                routeMessage(cmd);
            }
            break;
        case CMD_GLOBAL_ERROR:

            if (getBrokerState() == BrokerState::CONNECTING) {
                processDisconnect();
            }
            setErrorState(cmd.messageID, cmd.payload.to_string());
            if (isConnected()) {
                sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                if (!(cmd.source_id == higher_broker_id || cmd.source_id == gRootBrokerID)) {
                    transmit(parent_route_id, std::move(cmd));
                }
            }
            break;
        default:
            break;
    }
}